

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThanEquals,false,false,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  sel_t sVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  
  if (count + 0x3f < 0x40) {
    lVar11 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar11 = 0;
    uVar7 = 0;
    uVar15 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar17 = 0xffffffffffffffff;
      }
      else {
        uVar17 = puVar1[uVar7];
      }
      uVar10 = uVar15 + 0x40;
      if (count <= uVar15 + 0x40) {
        uVar10 = count;
      }
      uVar9 = uVar15;
      if (uVar17 == 0xffffffffffffffff) {
        if (uVar15 < uVar10) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          uVar17 = uVar15 << 4 | 8;
          do {
            uVar9 = uVar15;
            if (psVar2 != (sel_t *)0x0) {
              uVar9 = (ulong)psVar2[uVar15];
            }
            lVar4 = *(long *)((long)&rdata->months + uVar17);
            lVar13 = (long)*(int *)((long)rdata + (uVar17 - 4)) + lVar4 / 86400000000;
            lVar5 = lVar13 % 0x1e;
            lVar18 = (long)*(int *)((long)rdata + (uVar17 - 8)) + lVar13 / 0x1e;
            lVar13 = *(long *)((long)&ldata->months + uVar17);
            lVar14 = (long)*(int *)((long)ldata + (uVar17 - 4)) + lVar13 / 86400000000;
            lVar6 = lVar14 % 0x1e;
            lVar14 = (long)*(int *)((long)ldata + (uVar17 - 8)) + lVar14 / 0x1e;
            uVar16 = 1;
            if (lVar18 <= lVar14) {
              if (lVar18 < lVar14) {
                uVar16 = 0;
              }
              else if (lVar5 <= lVar6) {
                uVar16 = (ulong)(lVar13 % 86400000000 < lVar4 % 86400000000 && lVar6 <= lVar5);
              }
            }
            psVar3[lVar11] = (sel_t)uVar9;
            lVar11 = lVar11 + uVar16;
            uVar15 = uVar15 + 1;
            uVar17 = uVar17 + 0x10;
            uVar9 = uVar15;
          } while (uVar10 != uVar15);
        }
      }
      else if (uVar17 == 0) {
        uVar9 = uVar10;
        if (uVar15 < uVar10) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar8 = (sel_t)uVar15;
            if (psVar2 != (sel_t *)0x0) {
              sVar8 = psVar2[uVar15];
            }
            psVar3[lVar11] = sVar8;
            lVar11 = lVar11 + 1;
            uVar15 = uVar15 + 1;
          } while (uVar10 != uVar15);
        }
      }
      else if (uVar15 < uVar10) {
        psVar2 = sel->sel_vector;
        psVar3 = false_sel->sel_vector;
        uVar9 = uVar15 << 4 | 8;
        uVar16 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar8 = (int)uVar15 + (int)uVar16;
          }
          else {
            sVar8 = psVar2[uVar15 + uVar16];
          }
          uVar12 = 1;
          if ((uVar17 >> (uVar16 & 0x3f) & 1) != 0) {
            lVar4 = *(long *)((long)&rdata->months + uVar9);
            lVar13 = (long)*(int *)((long)rdata + (uVar9 - 4)) + lVar4 / 86400000000;
            lVar6 = lVar13 % 0x1e;
            lVar18 = (long)*(int *)((long)rdata + (uVar9 - 8)) + lVar13 / 0x1e;
            lVar13 = *(long *)((long)&ldata->months + uVar9);
            lVar14 = (long)*(int *)((long)ldata + (uVar9 - 4)) + lVar13 / 86400000000;
            lVar5 = lVar14 % 0x1e;
            lVar14 = (long)*(int *)((long)ldata + (uVar9 - 8)) + lVar14 / 0x1e;
            if (lVar18 <= lVar14) {
              if (lVar18 < lVar14) {
                uVar12 = 0;
              }
              else if (lVar6 <= lVar5) {
                uVar12 = (ulong)(lVar13 % 86400000000 < lVar4 % 86400000000 && lVar5 <= lVar6);
              }
            }
          }
          psVar3[lVar11] = sVar8;
          lVar11 = uVar12 + lVar11;
          uVar16 = uVar16 + 1;
          uVar9 = uVar9 + 0x10;
        } while ((uVar15 - uVar10) + uVar16 != 0);
        uVar9 = uVar15 + uVar16;
      }
      uVar7 = uVar7 + 1;
      uVar15 = uVar9;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return count - lVar11;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}